

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScene::setForegroundBrush(QGraphicsScene *this,QBrush *brush)

{
  QGraphicsView **ppQVar1;
  QWidget *this_00;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRectF local_68;
  QArrayDataPointer<QGraphicsView_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QBrush::operator=((QBrush *)(*(long *)(this + 8) + 0x178),brush);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
  views((QList<QGraphicsView_*> *)&local_48,this);
  ppQVar1 = local_48.ptr;
  lVar3 = local_48.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)((long)ppQVar1 + lVar2));
    QWidget::update(this_00);
  }
  local_68.w = 0.0;
  local_68.h = 0.0;
  local_68.xp = 0.0;
  local_68.yp = 0.0;
  update(this,&local_68);
  QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::setForegroundBrush(const QBrush &brush)
{
    Q_D(QGraphicsScene);
    d->foregroundBrush = brush;
    const auto views_ = views();
    for (QGraphicsView *view : views_)
        view->viewport()->update();
    update();
}